

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O3

poptOption *
findOption(poptOption *opt,char *longName,size_t longNameLen,char shortName,
          poptCallbackType *callback,void **callbackData,uint argInfo)

{
  int iVar1;
  poptOption *ppVar2;
  poptOption *ppVar3;
  char *pcVar4;
  uint uVar5;
  poptOption *ppVar6;
  poptOption *opt_00;
  poptOption *ppVar7;
  
  if ((((longName != (char *)0x0) && (shortName == '\0')) && ((int)argInfo < 0)) &&
     (shortName = '-', *longName != '\0')) {
    shortName = '\0';
  }
  ppVar6 = (poptOption *)0x0;
  ppVar2 = (poptOption *)0x0;
  do {
    pcVar4 = opt->longName;
    if (((pcVar4 == (char *)0x0) && (opt->shortName == '\0')) && (opt->arg == (void *)0x0)) {
LAB_00104947:
      if (opt->shortName == '\0') {
        return (poptOption *)0x0;
      }
      goto LAB_0010494e;
    }
    opt_00 = (poptOption *)opt->arg;
    uVar5 = _poptArgMask & opt->argInfo;
    ppVar3 = ppVar6;
    ppVar7 = ppVar2;
    if (uVar5 == 4) {
      if (opt_00 == poptHelpOptions) {
        opt_00 = poptHelpOptionsI18N;
      }
      if ((opt_00 != (poptOption *)0x0) &&
         (ppVar2 = findOption(opt_00,longName,longNameLen,shortName,callback,callbackData,argInfo),
         ppVar2 != (poptOption *)0x0)) {
        if ((callback != (poptCallbackType *)0x0) &&
           (((callbackData != (void **)0x0 && (*callback != (poptCallbackType)0x0)) &&
            (ppVar6 = opt, *callbackData == (void *)0x0)))) {
LAB_00104978:
          pcVar4 = ppVar6->descrip;
LAB_00104983:
          *callbackData = pcVar4;
        }
        return ppVar2;
      }
    }
    else {
      ppVar3 = opt;
      ppVar7 = opt_00;
      if (uVar5 != 5) {
        if (((pcVar4 == (char *)0x0) ||
            ((int)argInfo < 0 && -1 < (int)opt->argInfo || longName == (char *)0x0)) ||
           (iVar1 = longOptionStrcmp(opt,longName,longNameLen), iVar1 == 0)) {
          ppVar3 = ppVar6;
          ppVar7 = ppVar2;
          if ((shortName == '\0') || (shortName != opt->shortName)) goto LAB_0010490b;
          if (pcVar4 == (char *)0x0) goto LAB_00104947;
        }
LAB_0010494e:
        if (callback != (poptCallbackType *)0x0) {
          if (ppVar6 == (poptOption *)0x0) {
            ppVar2 = (poptOption *)0x0;
          }
          *callback = (poptCallbackType)ppVar2;
        }
        if (callbackData == (void **)0x0) {
          return opt;
        }
        ppVar2 = opt;
        if ((ppVar6 != (poptOption *)0x0) && ((ppVar6->argInfo & 0x20000000) == 0))
        goto LAB_00104978;
        pcVar4 = (char *)0x0;
        goto LAB_00104983;
      }
    }
LAB_0010490b:
    opt = opt + 1;
    ppVar6 = ppVar3;
    ppVar2 = ppVar7;
  } while( true );
}

Assistant:

static const struct poptOption *
findOption(const struct poptOption * opt,
		const char * longName, size_t longNameLen,
		char shortName,
		poptCallbackType * callback,
		const void ** callbackData,
		unsigned int argInfo)
{
    const struct poptOption * cb = NULL;
    poptArg cbarg = { .ptr = NULL };

    /* This happens when a single - is given */
    if (LF_ISSET(ONEDASH) && !shortName && (longName && *longName == '\0'))
	shortName = '-';

    for (; opt->longName || opt->shortName || opt->arg; opt++) {
	poptArg arg = { .ptr = opt->arg };

	switch (poptArgType(opt)) {
	case POPT_ARG_INCLUDE_TABLE:	/* Recurse on included sub-tables. */
	{   const struct poptOption * opt2;

	    poptSubstituteHelpI18N(arg.opt);	/* XXX side effects */
	    if (arg.ptr == NULL) continue;	/* XXX program error */
	    opt2 = findOption(arg.opt, longName, longNameLen, shortName, callback,
			      callbackData, argInfo);
	    if (opt2 == NULL) continue;
	    /* Sub-table data will be inherited if no data yet. */
	    if (callback && *callback
	     && callbackData && *callbackData == NULL)
		*callbackData = opt->descrip;
	    return opt2;
	}   break;
	case POPT_ARG_CALLBACK:
	    cb = opt;
	    cbarg.ptr = opt->arg;
	    continue;
	    break;
	default:
	    break;
	}

	if (longName != NULL && opt->longName != NULL &&
		   (!LF_ISSET(ONEDASH) || F_ISSET(opt, ONEDASH)) &&
		   longOptionStrcmp(opt, longName, longNameLen))
	{
	    break;
	} else if (shortName && shortName == opt->shortName) {
	    break;
	}
    }

    if (opt->longName == NULL && !opt->shortName)
	return NULL;

    if (callback)
	*callback = (cb ? cbarg.cb : NULL);
    if (callbackData)
	*callbackData = (cb && !CBF_ISSET(cb, INC_DATA) ? cb->descrip : NULL);

    return opt;
}